

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O3

int zmaxheap_remove_index(zmaxheap_t *heap,int idx,void *p,float *v)

{
  int iVar1;
  int iVar2;
  float fVar3;
  size_t __n;
  int iVar4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  iVar4 = heap->size;
  iVar5 = 0;
  if (idx < iVar4) {
    lVar6 = (long)idx;
    if (v != (float *)0x0) {
      *v = heap->values[lVar6];
    }
    if (p != (void *)0x0) {
      memcpy(p,heap->data + heap->el_sz * lVar6,heap->el_sz);
      iVar4 = heap->size;
    }
    iVar4 = iVar4 + -1;
    heap->size = iVar4;
    iVar5 = 1;
    if (iVar4 != idx) {
      heap->values[lVar6] = heap->values[iVar4];
      __n = heap->el_sz;
      memcpy(heap->data + __n * lVar6,heap->data + (long)iVar4 * __n,__n);
      iVar4 = heap->size;
      if (idx < iVar4) {
        fVar3 = heap->values[lVar6];
        do {
          fVar8 = -INFINITY;
          iVar1 = idx * 2 + 1;
          fVar7 = -INFINITY;
          if (iVar1 < iVar4) {
            fVar7 = heap->values[iVar1];
          }
          iVar2 = idx * 2 + 2;
          if (iVar2 < iVar4) {
            fVar8 = heap->values[iVar2];
          }
          if ((fVar7 <= fVar3) && (fVar8 <= fVar3)) {
            return 1;
          }
          if (fVar8 <= fVar7) {
            if (iVar4 <= iVar1) {
              __assert_fail("left < heap->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                            ,0xe5,"int zmaxheap_remove_index(zmaxheap_t *, int, void *, float *)");
            }
          }
          else {
            iVar1 = iVar2;
            if (iVar4 <= iVar2) {
              __assert_fail("right < heap->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                            ,0xea,"int zmaxheap_remove_index(zmaxheap_t *, int, void *, float *)");
            }
          }
          (*heap->swap)(heap,idx,iVar1);
          iVar4 = heap->size;
          idx = iVar1;
        } while (iVar1 < iVar4);
      }
    }
  }
  return iVar5;
}

Assistant:

int zmaxheap_remove_index(zmaxheap_t *heap, int idx, void *p, float *v)
{
    if (idx >= heap->size)
        return 0;

    // copy out the requested element from the heap.
    if (v != NULL)
        *v = heap->values[idx];
    if (p != NULL)
        memcpy(p, &heap->data[idx*heap->el_sz], heap->el_sz);

    heap->size--;

    // If this element is already the last one, then there's nothing
    // for us to do.
    if (idx == heap->size)
        return 1;

    // copy last element to first element. (which probably upsets
    // the heap property).
    heap->values[idx] = heap->values[heap->size];
    memcpy(&heap->data[idx*heap->el_sz], &heap->data[heap->el_sz * heap->size], heap->el_sz);

    // now fix the heap. Note, as we descend, we're "pushing down"
    // the same node the entire time. Thus, while the index of the
    // parent might change, the parent_score doesn't.
    int parent = idx;
    float parent_score = heap->values[idx];

    // descend, fixing the heap.
    while (parent < heap->size) {

        int left = 2*parent + 1;
        int right = left + 1;

//            assert(parent_score == heap->values[parent]);

        float left_score = (left < heap->size) ? heap->values[left] : -INFINITY;
        float right_score = (right < heap->size) ? heap->values[right] : -INFINITY;

        // put the biggest of (parent, left, right) as the parent.

        // already okay?
        if (parent_score >= left_score && parent_score >= right_score)
            break;

        // if we got here, then one of the children is bigger than the parent.
        if (left_score >= right_score) {
            assert(left < heap->size);
            heap->swap(heap, parent, left);
            parent = left;
        } else {
            // right_score can't be less than left_score if right_score is -INFINITY.
            assert(right < heap->size);
            heap->swap(heap, parent, right);
            parent = right;
        }
    }

    return 1;
}